

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,IfStmt *stmt)

{
  undefined1 *puVar1;
  uint32_t uVar2;
  uint uVar3;
  element_type *peVar4;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ostream *poVar6;
  string_view sVar7;
  undefined1 local_68 [8];
  shared_ptr<kratos::Stmt> first_stmt;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_48;
  ostream *local_38;
  
  if (this->generator_->debug == true) {
    (stmt->super_Stmt).super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68,
               &(stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    uVar2 = *(uint32_t *)((long)local_68 + 0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&first_stmt);
    if (uVar2 == 0) {
      uVar2 = *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68,
                 &(stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      *(uint32_t *)((long)local_68 + 0x20) = uVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&first_stmt);
    }
  }
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar7 = indent(this);
  local_38 = (ostream *)puVar1;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar7._M_str,sVar7._M_len);
  poVar6 = std::operator<<(poVar6,"if (");
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  Stream::var_str_abi_cxx11_((string *)local_68,&this->stream_,local_48._M_ptr);
  poVar6 = std::operator<<(poVar6,(string *)local_68);
  std::operator<<(poVar6,") ");
  std::__cxx11::string::~string((string *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  (**this->_vptr_SystemVerilogCodeGen)
            (this,(stmt->then_body_).
                  super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar4 = (stmt->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = &((peVar4->super_StmtBlock).stmts_.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  if (p_Var5 != &((peVar4->super_StmtBlock).stmts_.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>) {
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var5);
    peVar4 = (stmt->else_body_).
             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((((long)(peVar4->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar4->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10) &&
        (uVar3 = *(uint *)&(((string *)((long)local_68 + 0x78))->_M_dataplus)._M_p, uVar3 < 9)) &&
       ((0x109U >> (uVar3 & 0x1f) & 1) != 0)) {
      sVar7 = indent(this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_38,sVar7._M_str,sVar7._M_len);
      std::operator<<(poVar6,"else ");
      this->skip_indent_ = true;
      peVar4 = (stmt->else_body_).
               super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar4->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
           *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
      std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 &((peVar4->super_StmtBlock).stmts_.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>);
      (**this->_vptr_SystemVerilogCodeGen)(this,local_48._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    else {
      sVar7 = indent(this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_38,sVar7._M_str,sVar7._M_len);
      std::operator<<(poVar6,"else ");
      (**this->_vptr_SystemVerilogCodeGen)
                (this,(stmt->else_body_).
                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&first_stmt);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(IfStmt* stmt) {
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
        if (stmt->predicate()->verilog_ln == 0) stmt->predicate()->verilog_ln = stream_.line_no();
    }
    stream_ << indent() << "if (" << stream_.var_str(stmt->predicate()) << ") ";
    auto const& then_body = stmt->then_body();
    dispatch_node(then_body.get());

    auto const& else_body = stmt->else_body();
    if (!else_body->empty()) {
        // special case where there is another (and only) if statement nested inside the else body
        // i.e. the else if case
        auto first_stmt = else_body->empty() ? nullptr : else_body->get_stmt(0);
        bool skip = else_body->size() == 1 && (first_stmt->type() == StatementType::Assign ||
                                               first_stmt->type() == StatementType::If ||
                                               first_stmt->type() == StatementType::Return);
        if (skip) {
            stream_ << indent() << "else ";
            skip_indent_ = true;
            else_body->verilog_ln = stream_.line_no();
            dispatch_node((*else_body)[0].get());
        } else {
            stream_ << indent() << "else ";
            dispatch_node(stmt->else_body().get());
        }
    }
}